

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct64_stage8_high48_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i w0;
  __m256i w0_00;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w1_04;
  __m256i w1_05;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  undefined4 uVar6;
  int32_t cos_bit_00;
  int32_t cos_bit_01;
  int32_t cos_bit_02;
  int32_t cos_bit_03;
  int32_t cos_bit_04;
  int32_t cos_bit_05;
  int32_t cos_bit_06;
  undefined4 uVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  longlong in_register_00001218;
  undefined1 in_stack_00000028 [32];
  undefined1 in_stack_00000048 [32];
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  
  uVar7 = 0x61ff138;
  uVar6 = 0xf138f9e1;
  alVar1 = x[0x10];
  alVar2 = x[0x11];
  alVar3 = x[0x12];
  alVar4 = x[0x13];
  alVar5 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x17]);
  x[0x10] = alVar5;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x17]);
  x[0x17] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[0x16]);
  x[0x11] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[0x16]);
  x[0x16] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar3,(undefined1  [32])x[0x15]);
  x[0x12] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar3,(undefined1  [32])x[0x15]);
  x[0x15] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar4,(undefined1  [32])x[0x14]);
  x[0x13] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar4,(undefined1  [32])x[0x14]);
  x[0x14] = alVar1;
  alVar1 = x[0x1f];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x18]);
  x[0x1f] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x18]);
  x[0x18] = alVar1;
  alVar1 = x[0x1e];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x19]);
  x[0x1e] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x19]);
  x[0x19] = alVar1;
  alVar1 = x[0x1d];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1a]);
  x[0x1d] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1a]);
  x[0x1a] = alVar1;
  alVar1 = x[0x1c];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1b]);
  x[0x1c] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1b]);
  x[0x1b] = alVar1;
  alVar1[1] = in_XMM0_Qb;
  alVar1[0] = in_XMM0_Qa;
  alVar1[2] = in_YMM0_H;
  alVar1[3] = in_register_00001218;
  w1[1]._0_4_ = 0x61ff138;
  w1[0] = 0x61ff138061ff138;
  w1[1]._4_4_ = 0x61ff138;
  w1[2]._0_4_ = 0x61ff138;
  w1[2]._4_4_ = 0x61ff138;
  w1[3]._0_4_ = 0x61ff138;
  w1[3]._4_4_ = 0x61ff138;
  _r_00[1]._0_4_ = 0xf138f9e1;
  _r_00[0] = 0xf138f9e1f138f9e1;
  _r_00[1]._4_4_ = 0xf138f9e1;
  _r_00[2]._0_4_ = 0xf138f9e1;
  _r_00[2]._4_4_ = 0xf138f9e1;
  _r_00[3]._0_4_ = 0xf138f9e1;
  _r_00[3]._4_4_ = 0xf138f9e1;
  uVar8 = uVar7;
  uVar9 = uVar7;
  uVar10 = uVar7;
  uVar11 = uVar7;
  uVar12 = uVar7;
  uVar13 = uVar7;
  uVar14 = uVar7;
  uVar15 = uVar6;
  uVar16 = uVar6;
  uVar17 = uVar6;
  uVar18 = uVar6;
  uVar19 = uVar6;
  uVar20 = uVar6;
  uVar21 = uVar6;
  btf_16_w16_avx2(alVar1,w1,x + 0x24,x + 0x3b,_r_00,0xf138);
  alVar2[1] = in_XMM0_Qb;
  alVar2[0] = in_XMM0_Qa;
  alVar2[2] = in_YMM0_H;
  alVar2[3] = in_register_00001218;
  w1_00[0]._4_4_ = uVar8;
  w1_00[0]._0_4_ = uVar7;
  w1_00[1]._0_4_ = uVar9;
  w1_00[1]._4_4_ = uVar10;
  w1_00[2]._0_4_ = uVar11;
  w1_00[2]._4_4_ = uVar12;
  w1_00[3]._0_4_ = uVar13;
  w1_00[3]._4_4_ = uVar14;
  _r_01[0]._4_4_ = uVar15;
  _r_01[0]._0_4_ = uVar6;
  _r_01[1]._0_4_ = uVar16;
  _r_01[1]._4_4_ = uVar17;
  _r_01[2]._0_4_ = uVar18;
  _r_01[2]._4_4_ = uVar19;
  _r_01[3]._0_4_ = uVar20;
  _r_01[3]._4_4_ = uVar21;
  btf_16_w16_avx2(alVar2,w1_00,x + 0x25,x + 0x3a,_r_01,cos_bit_00);
  alVar3[1] = in_XMM0_Qb;
  alVar3[0] = in_XMM0_Qa;
  alVar3[2] = in_YMM0_H;
  alVar3[3] = in_register_00001218;
  w1_01[0]._4_4_ = uVar8;
  w1_01[0]._0_4_ = uVar7;
  w1_01[1]._0_4_ = uVar9;
  w1_01[1]._4_4_ = uVar10;
  w1_01[2]._0_4_ = uVar11;
  w1_01[2]._4_4_ = uVar12;
  w1_01[3]._0_4_ = uVar13;
  w1_01[3]._4_4_ = uVar14;
  _r_02[0]._4_4_ = uVar15;
  _r_02[0]._0_4_ = uVar6;
  _r_02[1]._0_4_ = uVar16;
  _r_02[1]._4_4_ = uVar17;
  _r_02[2]._0_4_ = uVar18;
  _r_02[2]._4_4_ = uVar19;
  _r_02[3]._0_4_ = uVar20;
  _r_02[3]._4_4_ = uVar21;
  btf_16_w16_avx2(alVar3,w1_01,x + 0x26,x + 0x39,_r_02,cos_bit_01);
  alVar4[1] = in_XMM0_Qb;
  alVar4[0] = in_XMM0_Qa;
  alVar4[2] = in_YMM0_H;
  alVar4[3] = in_register_00001218;
  w1_02[0]._4_4_ = uVar8;
  w1_02[0]._0_4_ = uVar7;
  w1_02[1]._0_4_ = uVar9;
  w1_02[1]._4_4_ = uVar10;
  w1_02[2]._0_4_ = uVar11;
  w1_02[2]._4_4_ = uVar12;
  w1_02[3]._0_4_ = uVar13;
  w1_02[3]._4_4_ = uVar14;
  _r_03[0]._4_4_ = uVar15;
  _r_03[0]._0_4_ = uVar6;
  _r_03[1]._0_4_ = uVar16;
  _r_03[1]._4_4_ = uVar17;
  _r_03[2]._0_4_ = uVar18;
  _r_03[2]._4_4_ = uVar19;
  _r_03[3]._0_4_ = uVar20;
  _r_03[3]._4_4_ = uVar21;
  btf_16_w16_avx2(alVar4,w1_02,x + 0x27,x + 0x38,_r_03,cos_bit_02);
  alVar5[1] = in_XMM0_Qb;
  alVar5[0] = in_XMM0_Qa;
  alVar5[2] = in_YMM0_H;
  alVar5[3] = in_register_00001218;
  w1_03[0]._4_4_ = uVar8;
  w1_03[0]._0_4_ = uVar7;
  w1_03[1]._0_4_ = uVar9;
  w1_03[1]._4_4_ = uVar10;
  w1_03[2]._0_4_ = uVar11;
  w1_03[2]._4_4_ = uVar12;
  w1_03[3]._0_4_ = uVar13;
  w1_03[3]._4_4_ = uVar14;
  _r_04[0]._4_4_ = uVar15;
  _r_04[0]._0_4_ = uVar6;
  _r_04[1]._0_4_ = uVar16;
  _r_04[1]._4_4_ = uVar17;
  _r_04[2]._0_4_ = uVar18;
  _r_04[2]._4_4_ = uVar19;
  _r_04[3]._0_4_ = uVar20;
  _r_04[3]._4_4_ = uVar21;
  btf_16_w16_avx2(alVar5,w1_03,x + 0x28,x + 0x37,_r_04,cos_bit_03);
  w0[1] = in_XMM0_Qb;
  w0[0] = in_XMM0_Qa;
  w0[2] = in_YMM0_H;
  w0[3] = in_register_00001218;
  w1_04[0]._4_4_ = uVar8;
  w1_04[0]._0_4_ = uVar7;
  w1_04[1]._0_4_ = uVar9;
  w1_04[1]._4_4_ = uVar10;
  w1_04[2]._0_4_ = uVar11;
  w1_04[2]._4_4_ = uVar12;
  w1_04[3]._0_4_ = uVar13;
  w1_04[3]._4_4_ = uVar14;
  _r_05[0]._4_4_ = uVar15;
  _r_05[0]._0_4_ = uVar6;
  _r_05[1]._0_4_ = uVar16;
  _r_05[1]._4_4_ = uVar17;
  _r_05[2]._0_4_ = uVar18;
  _r_05[2]._4_4_ = uVar19;
  _r_05[3]._0_4_ = uVar20;
  _r_05[3]._4_4_ = uVar21;
  btf_16_w16_avx2(w0,w1_04,x + 0x29,x + 0x36,_r_05,cos_bit_04);
  w0_00[1] = in_XMM0_Qb;
  w0_00[0] = in_XMM0_Qa;
  w0_00[2] = in_YMM0_H;
  w0_00[3] = in_register_00001218;
  w1_05[0]._4_4_ = uVar8;
  w1_05[0]._0_4_ = uVar7;
  w1_05[1]._0_4_ = uVar9;
  w1_05[1]._4_4_ = uVar10;
  w1_05[2]._0_4_ = uVar11;
  w1_05[2]._4_4_ = uVar12;
  w1_05[3]._0_4_ = uVar13;
  w1_05[3]._4_4_ = uVar14;
  _r_06[0]._4_4_ = uVar15;
  _r_06[0]._0_4_ = uVar6;
  _r_06[1]._0_4_ = uVar16;
  _r_06[1]._4_4_ = uVar17;
  _r_06[2]._0_4_ = uVar18;
  _r_06[2]._4_4_ = uVar19;
  _r_06[3]._0_4_ = uVar20;
  _r_06[3]._4_4_ = uVar21;
  btf_16_w16_avx2(w0_00,w1_05,x + 0x2a,x + 0x35,_r_06,cos_bit_05);
  btf_16_w16_avx2(_r,(__m256i)in_stack_00000028,x + 0x2b,x + 0x34,(__m256i)in_stack_00000048,
                  cos_bit_06);
  return;
}

Assistant:

static inline void idct64_stage8_high48_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  btf_16_adds_subs_avx2(&x[16], &x[23]);
  btf_16_adds_subs_avx2(&x[17], &x[22]);
  btf_16_adds_subs_avx2(&x[18], &x[21]);
  btf_16_adds_subs_avx2(&x[19], &x[20]);
  btf_16_adds_subs_avx2(&x[31], &x[24]);
  btf_16_adds_subs_avx2(&x[30], &x[25]);
  btf_16_adds_subs_avx2(&x[29], &x[26]);
  btf_16_adds_subs_avx2(&x[28], &x[27]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[36], &x[59], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[37], &x[58], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[38], &x[57], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[39], &x[56], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[40], &x[55], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[41], &x[54], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[42], &x[53], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[43], &x[52], _r, cos_bit);
}